

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatcc_json_parser.h
# Opt level: O2

char * flatcc_json_parser_space(flatcc_json_parser_t *ctx,char *buf,char *end)

{
  char cVar1;
  ulong uVar2;
  short *psVar3;
  ulong uVar4;
  
  if ((long)end - (long)buf < 2) {
flatcc_json_parser_space_ext:
    do {
      psVar3 = (short *)buf;
      if (0xf < (long)end - (long)buf) {
        if (' ' < (char)*(short *)buf) {
          return (char *)(short *)buf;
        }
        uVar2 = (ulong)(*(short *)buf == 0x2020);
        uVar4 = (ulong)((char)*(short *)((long)buf + uVar2 * 2) == ' ');
        psVar3 = (short *)((long)buf + uVar4 + uVar2 * 2);
        if (' ' < *(char *)((long)buf + uVar4 + uVar2 * 2)) {
          return (char *)psVar3;
        }
      }
      for (; (buf = end, psVar3 != (short *)end && (buf = (char *)psVar3, (char)*psVar3 == ' '));
          psVar3 = (short *)((long)psVar3 + 1)) {
      }
      while( true ) {
        while( true ) {
          while( true ) {
            if (buf == end) {
              return (char *)(short *)buf;
            }
            cVar1 = (char)*(short *)buf;
            if (' ' < cVar1) {
              return (char *)(short *)buf;
            }
            if (cVar1 != '\t') break;
            buf = (char *)((long)buf + 1);
          }
          if (cVar1 != '\n') break;
          ctx->line = ctx->line + 1;
          ctx->line_start = (char *)((long)buf + 1);
          buf = (char *)((long)buf + 1);
        }
        if (cVar1 != '\r') break;
        if ((long)end - (long)buf < 2) {
          uVar2 = 0;
        }
        else {
          uVar2 = (ulong)(*(char *)((long)buf + 1) == '\n');
        }
        ctx->line = ctx->line + 1;
        buf = (char *)((long)buf + uVar2 + 1);
        ctx->line_start = buf;
      }
      if (cVar1 != ' ') {
        if (ctx->error == 0) {
          ctx->error = 5;
          ctx->pos = ((int)buf - *(int *)&ctx->line_start) + 1;
          ctx->error_loc = buf;
          return end;
        }
        return end;
      }
    } while( true );
  }
  if (*buf < '!') {
    if ((*buf != ' ') || (buf[1] < '!')) goto flatcc_json_parser_space_ext;
    buf = buf + 1;
  }
  return buf;
}

Assistant:

static inline const char *flatcc_json_parser_space(flatcc_json_parser_t *ctx, const char *buf, const char *end)
{
    if (end - buf > 1) {
        if (buf[0] > 0x20) {
            return buf;
        }
        if (buf[0] == 0x20 && buf[1] > 0x20) {
            return buf + 1;
        }
    }
    return flatcc_json_parser_space_ext(ctx, buf, end);
}